

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O3

void __thiscall
helics::helicsCLI11App::addTypeOption(helicsCLI11App *this,bool includeEnvironmentVariable)

{
  _Manager_type p_Var1;
  _Invoker_type p_Var2;
  undefined8 uVar3;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  App *this_00;
  Option *pOVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  CoreType type;
  _Any_data __tmp;
  _Any_data local_158;
  code *local_148;
  code *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70 [2];
  
  local_70[0]._M_dataplus._M_p = (pointer)&local_70[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"network type","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
  this_00 = &CLI::App::add_option_group<CLI::Option_group>(&this->super_App,local_70,&local_d0)->
             super_App;
  this_00->immediate_callback_ = true;
  p_Var1 = (this_00->final_callback_).super__Function_base._M_manager;
  if ((p_Var1 != (_Manager_type)0x0) &&
     ((this_00->parse_complete_callback_).super__Function_base._M_manager == (_Manager_type)0x0)) {
    local_158._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(this_00->final_callback_).super__Function_base._M_functor;
    local_158._8_8_ =
         *(undefined8 *)((long)&(this_00->final_callback_).super__Function_base._M_functor + 8);
    uVar3 = *(undefined8 *)
             ((long)&(this_00->parse_complete_callback_).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this_00->final_callback_).super__Function_base._M_functor =
         *(undefined8 *)&(this_00->parse_complete_callback_).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this_00->final_callback_).super__Function_base._M_functor + 8) = uVar3;
    *(undefined8 *)&(this_00->parse_complete_callback_).super__Function_base._M_functor =
         local_158._M_unused._M_object;
    *(undefined8 *)((long)&(this_00->parse_complete_callback_).super__Function_base._M_functor + 8)
         = local_158._8_8_;
    (this_00->final_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
    (this_00->parse_complete_callback_).super__Function_base._M_manager = p_Var1;
    p_Var2 = (this_00->final_callback_)._M_invoker;
    (this_00->final_callback_)._M_invoker = (this_00->parse_complete_callback_)._M_invoker;
    (this_00->parse_complete_callback_)._M_invoker = p_Var2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70[0]._M_dataplus._M_p != &local_70[0].field_2) {
    operator_delete(local_70[0]._M_dataplus._M_p,local_70[0].field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"--coretype,-t","");
  local_158._8_8_ = 0;
  local_140 = CLI::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/../core/helicsCLI11.hpp:180:19)>
              ::_M_invoke;
  local_148 = CLI::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/../core/helicsCLI11.hpp:180:19)>
              ::_M_manager;
  local_158._M_unused._M_object = this;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"type of the core to connect to","");
  pOVar4 = CLI::App::add_option_function<std::__cxx11::string>
                     (this_00,&local_90,
                      (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&local_158,&local_f0);
  helics::core::to_string_abi_cxx11_(&local_b0,(core *)(ulong)this->coreType,type);
  pbVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           replace(&local_b0,0,0,"(",1);
  local_130._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar6 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p == paVar6) {
    local_130.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_130.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  }
  else {
    local_130.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_130._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  pbVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           append(&local_130,")");
  local_110._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar6 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p == paVar6) {
    local_110.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_110._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar4->default_str_,&local_110);
  pOVar4 = CLI::Option::ignore_case<CLI::App>(pOVar4,true);
  CLI::Option::ignore_underscore<CLI::App>(pOVar4,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_148 != (code *)0x0) {
    (*local_148)(&local_158,&local_158,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (includeEnvironmentVariable) {
    addTypeOption();
  }
  return;
}

Assistant:

void addTypeOption(bool includeEnvironmentVariable = true)
    {
        auto* og = add_option_group("network type")->immediate_callback();
        auto* typeOption =
            og->add_option_function<std::string>(
                  "--coretype,-t",
                  [this](const std::string& val) {
                      coreType = coreTypeFromString(val);
                      if (coreType == CoreType::UNRECOGNIZED) {
                          throw CLI::ValidationError(val + " is NOT a recognized core type");
                      }
                  },
                  "type of the core to connect to")
                ->default_str("(" + to_string(coreType) + ")")
                ->ignore_case()
                ->ignore_underscore();
        if (includeEnvironmentVariable) {
            typeOption->envname("HELICS_CORE_TYPE");
        }
    }